

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O0

bool __thiscall icu_63::RBBITableBuilder::findDuplicateState(RBBITableBuilder *this,IntPair *states)

{
  bool bVar1;
  int32_t iVar2;
  int32_t iVar3;
  int32_t iVar4;
  int32_t iVar5;
  void *pvVar6;
  void *pvVar7;
  int32_t duplVal;
  int32_t firstVal;
  int32_t col;
  bool rowsMatch;
  RBBIStateDescriptor *duplSD;
  RBBIStateDescriptor *firstSD;
  int32_t numCols;
  int32_t numStates;
  IntPair *states_local;
  RBBITableBuilder *this_local;
  
  iVar2 = UVector::size(this->fDStates);
  iVar3 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  do {
    if (iVar2 + -1 <= states->first) {
      return false;
    }
    pvVar6 = UVector::elementAt(this->fDStates,states->first);
    states->second = states->first + 1;
    while (states->second < iVar2) {
      pvVar7 = UVector::elementAt(this->fDStates,states->second);
      if (((*(int *)((long)pvVar6 + 4) == *(int *)((long)pvVar7 + 4)) &&
          (*(int *)((long)pvVar6 + 8) == *(int *)((long)pvVar7 + 8))) &&
         (*(int *)((long)pvVar6 + 0x18) == *(int *)((long)pvVar7 + 0x18))) {
        bVar1 = true;
        for (duplVal = 0; duplVal < iVar3; duplVal = duplVal + 1) {
          iVar4 = UVector32::elementAti(*(UVector32 **)((long)pvVar6 + 0x28),duplVal);
          iVar5 = UVector32::elementAti(*(UVector32 **)((long)pvVar7 + 0x28),duplVal);
          if ((iVar4 != iVar5) &&
             (((iVar4 != states->first && (iVar4 != states->second)) ||
              ((iVar5 != states->first && (iVar5 != states->second)))))) {
            bVar1 = false;
            break;
          }
        }
        if (bVar1) {
          return true;
        }
      }
      states->second = states->second + 1;
    }
    states->first = states->first + 1;
  } while( true );
}

Assistant:

bool RBBITableBuilder::findDuplicateState(IntPair *states) {
    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();

    for (; states->first<numStates-1; states->first++) {
        RBBIStateDescriptor *firstSD = (RBBIStateDescriptor *)fDStates->elementAt(states->first);
        for (states->second=states->first+1; states->second<numStates; states->second++) {
            RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(states->second);
            if (firstSD->fAccepting != duplSD->fAccepting ||
                firstSD->fLookAhead != duplSD->fLookAhead ||
                firstSD->fTagsIdx   != duplSD->fTagsIdx) {
                continue;
            }
            bool rowsMatch = true;
            for (int32_t col=0; col < numCols; ++col) {
                int32_t firstVal = firstSD->fDtran->elementAti(col);
                int32_t duplVal = duplSD->fDtran->elementAti(col);
                if (!((firstVal == duplVal) ||
                        ((firstVal == states->first || firstVal == states->second) &&
                        (duplVal  == states->first || duplVal  == states->second)))) {
                    rowsMatch = false;
                    break;
                }
            }
            if (rowsMatch) {
                return true;
            }
        }
    }
    return false;
}